

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.h
# Opt level: O2

bool __thiscall crn_comp_params::check(crn_comp_params *this)

{
  uint uVar1;
  
  if (((((this->m_file_type < 2) && (this->m_quality_level < 0x100)) &&
       (this->m_dxt1a_alpha_threshold < 0x100)) &&
      ((((this->m_faces == 6 || (this->m_faces == 1)) &&
        ((0xffffefff < this->m_width - 0x1001 &&
         ((0xffffefff < this->m_height - 0x1001 && (0xffffffef < this->m_levels - 0x11)))))) &&
       ((ulong)this->m_format < 0xf)))) &&
     (((this->m_crn_color_endpoint_palette_size == 0 ||
        0xffffe006 < this->m_crn_color_endpoint_palette_size - 0x2001 &&
       (this->m_crn_color_selector_palette_size == 0 ||
        0xffffe006 < this->m_crn_color_selector_palette_size - 0x2001)) &&
      (this->m_crn_alpha_endpoint_palette_size == 0 ||
       0xffffe006 < this->m_crn_alpha_endpoint_palette_size - 0x2001)))) {
    if (this->m_crn_alpha_selector_palette_size == 0) {
      uVar1 = this->m_alpha_component;
    }
    else {
      if (this->m_crn_alpha_selector_palette_size - 0x2001 < 0xffffe007) {
        return false;
      }
      uVar1 = this->m_alpha_component;
    }
    if (uVar1 < 4) {
      return this->m_dxt_compressor_type < cCRNTotalDXTCompressors &&
             (this->m_dxt_quality < cCRNDXTQualityTotal && this->m_num_helper_threads < 0x10);
    }
  }
  return false;
}

Assistant:

inline bool check() const
    {
        if ((m_file_type > cCRNFileTypeDDS) ||
            (((int)m_quality_level < (int)cCRNMinQualityLevel) || ((int)m_quality_level > (int)cCRNMaxQualityLevel)) ||
            (m_dxt1a_alpha_threshold > 255) ||
            ((m_faces != 1) && (m_faces != 6)) ||
            ((m_width < 1) || (m_width > cCRNMaxLevelResolution)) ||
            ((m_height < 1) || (m_height > cCRNMaxLevelResolution)) ||
            ((m_levels < 1) || (m_levels > cCRNMaxLevels)) ||
            ((m_format < cCRNFmtDXT1) || (m_format >= cCRNFmtTotal)) ||
            ((m_crn_color_endpoint_palette_size) && ((m_crn_color_endpoint_palette_size < cCRNMinPaletteSize) || (m_crn_color_endpoint_palette_size > cCRNMaxPaletteSize))) ||
            ((m_crn_color_selector_palette_size) && ((m_crn_color_selector_palette_size < cCRNMinPaletteSize) || (m_crn_color_selector_palette_size > cCRNMaxPaletteSize))) ||
            ((m_crn_alpha_endpoint_palette_size) && ((m_crn_alpha_endpoint_palette_size < cCRNMinPaletteSize) || (m_crn_alpha_endpoint_palette_size > cCRNMaxPaletteSize))) ||
            ((m_crn_alpha_selector_palette_size) && ((m_crn_alpha_selector_palette_size < cCRNMinPaletteSize) || (m_crn_alpha_selector_palette_size > cCRNMaxPaletteSize))) ||
            (m_alpha_component > 3) ||
            (m_num_helper_threads > cCRNMaxHelperThreads) ||
            (m_dxt_quality > cCRNDXTQualityUber) ||
            (m_dxt_compressor_type >= cCRNTotalDXTCompressors))
        {
            return false;
        }
        return true;
    }